

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

ostream * operator<<(ostream *os,PlayerState state)

{
  if (state < (IDLE|DEFENDING)) {
    std::operator<<(os,&DAT_0012b548 + *(int *)(&DAT_0012b548 + (ulong)state * 4));
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const PlayerState state) {
    switch (state) {
        case ATTACKING:
            os << "Attacking";
            break;
        case DEFENDING:
            os << "Defending";
            break;
        case FORTIFYING:
            os << "Fortifying";
            break;
        case REINFORCING:
            os << "Reinforcing";
            break;
        case IDLE:
            os << "Idle";
            break;
    }
    return os;
}